

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3NextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  sqlite3_int64 sVar2;
  long *in_RDI;
  Fts3Table *pTab;
  Fts3Cursor *pCsr;
  int rc;
  int in_stack_ffffffffffffffdc;
  Fts3Cursor *in_stack_ffffffffffffffe0;
  sqlite3_stmt *pStmt;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  uVar3 = 0xaaaaaaaa;
  if (((short)in_RDI[1] == 1) || ((short)in_RDI[1] == 0)) {
    pStmt = (sqlite3_stmt *)*in_RDI;
    *(int *)(pStmt + 0x68) = *(int *)(pStmt + 0x68) + 1;
    iVar1 = sqlite3_step((sqlite3_stmt *)pTab);
    if (iVar1 == 100) {
      sVar2 = sqlite3_column_int64(pStmt,in_stack_ffffffffffffffdc);
      in_RDI[6] = sVar2;
      iVar1 = 0;
    }
    else {
      *(undefined1 *)((long)in_RDI + 10) = 1;
      iVar1 = sqlite3_reset((sqlite3_stmt *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
    }
    *(int *)(pStmt + 0x68) = *(int *)(pStmt + 0x68) + -1;
  }
  else {
    iVar1 = fts3EvalNext(in_stack_ffffffffffffffe0);
  }
  return iVar1;
}

Assistant:

static int fts3NextMethod(sqlite3_vtab_cursor *pCursor){
  int rc;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;
  if( pCsr->eSearch==FTS3_DOCID_SEARCH || pCsr->eSearch==FTS3_FULLSCAN_SEARCH ){
    Fts3Table *pTab = (Fts3Table*)pCursor->pVtab;
    pTab->bLock++;
    if( SQLITE_ROW!=sqlite3_step(pCsr->pStmt) ){
      pCsr->isEof = 1;
      rc = sqlite3_reset(pCsr->pStmt);
    }else{
      pCsr->iPrevId = sqlite3_column_int64(pCsr->pStmt, 0);
      rc = SQLITE_OK;
    }
    pTab->bLock--;
  }else{
    rc = fts3EvalNext((Fts3Cursor *)pCursor);
  }
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}